

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManComputeEigenvectors(Emb_Man_t *p,int nDims,int nSols)

{
  float *pVec;
  float *pVecDest;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  
  if (nDims <= nSols) {
    __assert_fail("nSols < nDims",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x552,"void Emb_ManComputeEigenvectors(Emb_Man_t *, int, int)");
  }
  pVec = p->pEigen[nSols];
  uVar4 = 0;
  uVar2 = (ulong)(uint)nSols;
  if (nSols < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    pVecDest = p->pEigen[uVar4];
    Emb_ManVecRandom(pVec,nDims);
    Emb_ManVecNormal(pVec,nDims);
    uVar1 = 0;
    do {
      Emb_ManVecCopyOne(pVecDest,pVec,nDims);
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        Emb_ManVecOrthogonolizeOne(p->pEigen[uVar3],pVecDest,nDims,pVec);
        Emb_ManVecCopyOne(pVecDest,pVec,nDims);
      }
      Emb_ManVecMultiply(p->pMatr,pVecDest,nDims,pVec);
      Emb_ManVecNormal(pVec,nDims);
      fVar6 = Emb_ManVecMultiplyOne(pVec,pVecDest,nDims);
    } while ((fVar6 < 0.999) && (bVar5 = uVar1 < 99, uVar1 = uVar1 + 1, bVar5));
    Emb_ManVecCopyOne(pVecDest,pVec,nDims);
  }
  return;
}

Assistant:

void Emb_ManComputeEigenvectors( Emb_Man_t * p, int nDims, int nSols )
{
    float * pVecUiHat, * pVecUi;
    int i, j, k;
    assert( nSols < nDims );
    pVecUiHat = p->pEigen[nSols];
    for ( i = 0; i < nSols; i++ )
    {
        pVecUi = p->pEigen[i];
        Emb_ManVecRandom( pVecUiHat, nDims );
        Emb_ManVecNormal( pVecUiHat, nDims );
        k = 0;
        do {
            k++;
            Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            for ( j = 0; j < i; j++ )
            {
                Emb_ManVecOrthogonolizeOne( p->pEigen[j], pVecUi, nDims, pVecUiHat );
                Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            }
            Emb_ManVecMultiply( p->pMatr, pVecUi, nDims, pVecUiHat );
            Emb_ManVecNormal( pVecUiHat, nDims );
        } while ( Emb_ManVecMultiplyOne( pVecUiHat, pVecUi, nDims ) < 0.999 && k < 100 );
        Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
//        printf( "Converged after %d iterations.\n", k );
    }
}